

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

void Cof_ManPrintFanio(Cof_Man_t *p)

{
  Cof_Obj_t *pCVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint *__ptr;
  void *__s;
  void *__s_00;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  size_t __size;
  double dVar21;
  double dVar22;
  double dVar23;
  char Buffer [100];
  uint *local_118;
  void *local_110;
  uint *local_100;
  uint *local_f8;
  double local_d8;
  double local_d0;
  double local_c8;
  char local_98 [104];
  
  iVar15 = p->nObjData;
  if (iVar15 < 1) {
    uVar11 = 0;
    local_c8 = 0.0;
    uVar10 = 10;
    local_d0 = 0.0;
    local_d8 = 0.0;
    uVar12 = 0;
    uVar13 = 0;
    bVar3 = false;
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    iVar14 = 0;
    iVar20 = 0;
    iVar17 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
    do {
      if (p->pObjData == (int *)0x0) break;
      pCVar1 = (Cof_Obj_t *)(p->pObjData + uVar16);
      uVar10 = *(uint *)pCVar1;
      uVar18 = uVar10;
      if (((int)uVar16 != 0) && ((uVar10 & 1) == 0)) {
        uVar5 = 0;
        if (0x1ff < uVar10) {
          *(uint *)pCVar1 = uVar10 & 0xfe | 0x100;
          uVar5 = Cof_NodeDeref_rec(pCVar1);
          uVar6 = Cof_NodeRef_rec(pCVar1);
          uVar18 = CONCAT31((int3)(uVar10 >> 8),*(undefined1 *)pCVar1);
          *(uint *)pCVar1 = uVar18;
          if (uVar5 != uVar6) goto LAB_00716a7b;
          iVar15 = p->nObjData;
        }
        uVar6 = uVar10 >> 4 & 0xf;
        uVar10 = uVar10 >> 8;
        iVar17 = iVar17 + uVar6;
        iVar20 = iVar20 + uVar10;
        iVar14 = iVar14 + uVar5;
        if ((uint)uVar13 <= uVar6) {
          uVar13 = (ulong)uVar6;
        }
        if ((uint)uVar12 <= uVar10) {
          uVar12 = (ulong)uVar10;
        }
        if ((int)uVar11 <= (int)uVar5) {
          uVar11 = (ulong)uVar5;
        }
      }
      uVar10 = (int)uVar16 + (uVar18 >> 8) + (uVar18 >> 4 & 0xf) + 6;
      uVar16 = (ulong)uVar10;
    } while ((int)uVar10 < iVar15);
    bVar3 = 0 < iVar15;
    uVar16 = uVar13;
    if (1 < (uint)uVar13) {
      uVar16 = 0;
      uVar10 = (uint)uVar13 - 1;
      do {
        uVar16 = (ulong)((int)uVar16 + 1);
        bVar2 = 9 < uVar10;
        uVar10 = uVar10 / 10;
      } while (bVar2);
    }
    uVar18 = (int)uVar16 * 10 + 10;
    uVar16 = uVar12;
    if (1 < (uint)uVar12) {
      uVar16 = 0;
      uVar10 = (uint)uVar12 - 1;
      do {
        uVar16 = (ulong)((int)uVar16 + 1);
        bVar2 = 9 < uVar10;
        uVar10 = uVar10 / 10;
      } while (bVar2);
    }
    local_d8 = (double)iVar17;
    local_d0 = (double)iVar20;
    local_c8 = (double)iVar14;
    uVar10 = (int)uVar16 * 10 + 10;
    if ((int)uVar10 < (int)uVar18) {
      uVar10 = uVar18;
    }
    uVar16 = uVar11;
    if (1 < (uint)uVar11) {
      uVar16 = 0;
      uVar18 = (uint)uVar11 - 1;
      do {
        uVar16 = (ulong)((int)uVar16 + 1);
        bVar2 = 9 < uVar18;
        uVar18 = uVar18 / 10;
      } while (bVar2);
    }
  }
  uVar18 = (int)uVar16 * 10 + 10;
  if ((int)uVar10 < (int)uVar18) {
    uVar10 = uVar18;
  }
  uVar18 = 0x10;
  if (0xe < uVar10 - 1) {
    uVar18 = uVar10;
  }
  if (uVar18 == 0) {
    __ptr = (uint *)malloc(0x10);
    __s_00 = (void *)0x0;
    *__ptr = 0;
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[1] = uVar10;
    local_f8 = (uint *)malloc(0x10);
    *local_f8 = 0;
    local_f8[2] = 0;
    local_f8[3] = 0;
    local_f8[1] = uVar10;
    __s = (void *)0x0;
    local_110 = (void *)0x0;
  }
  else {
    __size = (long)(int)uVar18 << 2;
    local_110 = malloc(__size);
    lVar19 = (long)(int)uVar10;
    if (local_110 != (void *)0x0) {
      memset(local_110,0,lVar19 * 4);
    }
    __ptr = (uint *)malloc(0x10);
    *__ptr = uVar18;
    __s = malloc(__size);
    *(void **)(__ptr + 2) = __s;
    __ptr[1] = uVar10;
    if (__s != (void *)0x0) {
      memset(__s,0,lVar19 * 4);
    }
    local_f8 = (uint *)malloc(0x10);
    *local_f8 = uVar18;
    __s_00 = malloc(__size);
    *(void **)(local_f8 + 2) = __s_00;
    local_f8[1] = uVar10;
    if (__s_00 == (void *)0x0) {
      __s_00 = (void *)0x0;
    }
    else {
      memset(__s_00,0,lVar19 << 2);
    }
  }
  local_100 = local_f8 + 1;
  local_118 = __ptr + 1;
  dVar21 = 0.0;
  if (bVar3) {
    iVar15 = 0;
    uVar16 = 0;
    do {
      if (p->pObjData == (int *)0x0) break;
      pCVar1 = (Cof_Obj_t *)(p->pObjData + uVar16);
      if (((int)uVar16 != 0) && (uVar18 = *(uint *)pCVar1, (uVar18 & 1) == 0)) {
        uVar8 = 0;
        if (0x1ff < uVar18) {
          *(uint *)pCVar1 = uVar18 & 0xfe | 0x100;
          uVar5 = Cof_NodeDeref_rec(pCVar1);
          uVar8 = (ulong)uVar5;
          uVar6 = Cof_NodeRef_rec(pCVar1);
          *(uint *)pCVar1 = CONCAT31((int3)(uVar18 >> 8),*(undefined1 *)pCVar1);
          if (uVar5 != uVar6) {
LAB_00716a7b:
            __assert_fail("Count1 == Count2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCof.c"
                          ,0x24e,"int Cof_ObjMffcSize(Cof_Obj_t *)");
          }
        }
        uVar5 = uVar18 >> 4 & 0xf;
        if (uVar5 < 10) {
          if ((int)uVar10 <= (int)uVar5) goto LAB_00716a5c;
          piVar7 = (int *)((long)local_110 + (ulong)uVar5 * 4);
        }
        else {
          piVar7 = (int *)((long)local_110 + 0x2c);
          if ((int)uVar10 < 0xc) goto LAB_00716a5c;
        }
        uVar5 = uVar18 >> 8;
        uVar9 = (ulong)uVar5;
        *piVar7 = *piVar7 + 1;
        if (uVar18 < 0xa00) {
LAB_007165f2:
          if ((int)*local_118 <= (int)uVar9) goto LAB_00716a5c;
LAB_007165fe:
          piVar7 = (int *)((long)__s + uVar9 * 4);
          *piVar7 = *piVar7 + 1;
        }
        else {
          if (uVar18 < 0x6400) {
            uVar9 = (ulong)(byte)((char)((uVar5 & 0xff) / 10) + 10);
            goto LAB_007165f2;
          }
          if (uVar18 < 0x3e800) {
            uVar18 = (uVar5 & 0xffff) / 100 + 0x14;
LAB_007166aa:
            if ((int)*local_118 <= (int)uVar18) goto LAB_00716a5c;
            uVar9 = (ulong)uVar18;
            goto LAB_007165fe;
          }
          if (uVar18 < 0x271000) {
            uVar18 = (uVar5 & 0xffff) / 1000 + 0x1e;
            goto LAB_007166aa;
          }
          if (uVar18 < 25600000) {
            uVar18 = uVar18 / 0x271000 + 0x28;
            if ((int)*local_118 <= (int)uVar18) goto LAB_00716a5c;
            uVar9 = (ulong)uVar18;
            goto LAB_007165fe;
          }
          if (uVar18 < 256000000) {
            uVar18 = uVar18 / 25600000 + 0x32;
LAB_0071678b:
            if ((int)*local_118 <= (int)uVar18) goto LAB_00716a5c;
            uVar9 = (ulong)uVar18;
            goto LAB_007165fe;
          }
          if (uVar18 < 2560000000) {
            uVar18 = uVar18 / 256000000 + 0x3c;
            goto LAB_0071678b;
          }
        }
        uVar18 = (uint)uVar8;
        if (uVar18 != 0) {
          iVar15 = iVar15 + 1;
          if ((int)uVar18 < 10) {
            if (((int)uVar18 < 0) || ((int)*local_100 <= (int)uVar18)) goto LAB_00716a5c;
          }
          else if (uVar18 < 100) {
            bVar4 = (char)((uVar18 & 0xff) / 10) + 10;
            uVar8 = (ulong)bVar4;
            if ((int)*local_100 <= (int)(uint)bVar4) goto LAB_00716a5c;
          }
          else {
            if (uVar18 < 1000) {
              uVar18 = (uint)((uVar8 & 0xffff) >> 2) / 0x19 + 0x14;
            }
            else {
              if (9999 < uVar18) {
                if (uVar18 < 100000) {
                  uVar18 = (int)(uVar8 / 10000) + 0x28;
                }
                else if (uVar18 < 1000000) {
                  uVar18 = uVar18 / 100000 + 0x32;
                }
                else {
                  if (9999999 < uVar18) goto LAB_007167c9;
                  uVar18 = (int)(uVar8 / 1000000) + 0x3c;
                }
                if ((int)*local_100 <= (int)uVar18) goto LAB_00716a5c;
                uVar8 = (ulong)uVar18;
                goto LAB_007167c5;
              }
              uVar18 = (uint)((uVar8 & 0xffff) >> 3) / 0x7d + 0x1e;
            }
            if ((int)*local_100 <= (int)uVar18) {
LAB_00716a5c:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            uVar8 = (ulong)uVar18;
          }
LAB_007167c5:
          piVar7 = (int *)((long)__s_00 + uVar8 * 4);
          *piVar7 = *piVar7 + 1;
        }
      }
LAB_007167c9:
      uVar18 = (int)uVar16 + (*(uint *)pCVar1 >> 8) + (*(uint *)pCVar1 >> 4 & 0xf) + 6;
      uVar16 = (ulong)uVar18;
    } while ((int)uVar18 < p->nObjData);
    dVar21 = (double)iVar15;
  }
  puts("The distribution of fanins, fanouts. and MFFCs in the network:");
  puts("         Number    Nodes with fanin   Nodes with fanout   Nodes with MFFC");
  if ((int)uVar10 < 1) {
    if (local_110 == (void *)0x0) goto LAB_007169d1;
  }
  else {
    uVar16 = 0;
    do {
      if (((*(int *)((long)local_110 + uVar16 * 4) != 0) ||
          (*(int *)(*(long *)(__ptr + 2) + uVar16 * 4) != 0)) ||
         (*(int *)(*(long *)(local_f8 + 2) + uVar16 * 4) != 0)) {
        if (uVar16 < 10) {
          printf("%15d : ",uVar16 & 0xffffffff);
        }
        else {
          iVar15 = (int)((uVar16 & 0xffffffff) / 10) * -10;
          dVar23 = (double)(int)((uVar16 & 0xffffffff) / 10);
          dVar22 = pow(10.0,dVar23);
          dVar23 = pow(10.0,dVar23);
          sprintf(local_98,"%d - %d",(ulong)(uint)(((int)uVar16 + iVar15) * (int)dVar22),
                  (ulong)(((int)uVar16 + iVar15 + 1) * (int)dVar23 - 1));
          printf("%15s : ",local_98);
        }
        if (*(int *)((long)local_110 + uVar16 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%11d   ");
        }
        printf("    ");
        if (*(int *)(*(long *)(__ptr + 2) + uVar16 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        printf("    ");
        if (*(int *)(*(long *)(local_f8 + 2) + uVar16 * 4) == 0) {
          printf("               ");
        }
        else {
          printf("  %12d  ");
        }
        putchar(10);
      }
      uVar16 = uVar16 + 1;
    } while (uVar10 != uVar16);
  }
  free(local_110);
LAB_007169d1:
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  if (*(void **)(local_f8 + 2) != (void *)0x0) {
    free(*(void **)(local_f8 + 2));
  }
  free(local_f8);
  printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.  MFFCs: Max = %d. Ave =  %.2f.\n"
         ,local_d8 / (double)p->nNodes,local_d0 / (double)p->nNodes,local_c8 / dVar21,uVar13,uVar12,
         uVar11);
  return;
}

Assistant:

void Cof_ManPrintFanio( Cof_Man_t * p )
{
    char Buffer[100];
    Cof_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts, * vMffcs;
    int nFanins, nFanouts, nMffcs, nFaninsMax, nFanoutsMax, nMffcsMax, nFaninsAll, nFanoutsAll, nMffcsAll;
    int i, k, nSizeMax, nMffcNodes = 0;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = nMffcsMax = 0;
    nFaninsAll = nFanoutsAll = nMffcsAll = 0;
    Cof_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue;
        nFanins  = Cof_ObjFaninNum(pNode);
        nFanouts = Cof_ObjFanoutNum(pNode);
        nMffcs   = pNode->nFanouts > 1 ? Cof_ObjMffcSize(pNode) : 0;
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nMffcsAll   += nMffcs;
        nFaninsMax   = Abc_MaxInt( nFaninsMax,  nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
        nMffcsMax    = Abc_MaxInt( nMffcsMax,   nMffcs );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nMffcsMax) + 1),  nSizeMax );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );
    vMffcs   = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Cof_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue;
        nFanins  = Cof_ObjFaninNum(pNode);
        nFanouts = Cof_ObjFanoutNum(pNode);
        nMffcs   = pNode->nFanouts > 1 ? Cof_ObjMffcSize(pNode) : 0;

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
       
        if ( nMffcs == 0 )
            continue;
        nMffcNodes++;

        if ( nMffcs < 10 )
            Vec_IntAddToEntry( vMffcs, nMffcs, 1 );
        else if ( nMffcs < 100 )
            Vec_IntAddToEntry( vMffcs, 10 + nMffcs/10, 1 );
        else if ( nMffcs < 1000 )
            Vec_IntAddToEntry( vMffcs, 20 + nMffcs/100, 1 );
        else if ( nMffcs < 10000 )
            Vec_IntAddToEntry( vMffcs, 30 + nMffcs/1000, 1 );
        else if ( nMffcs < 100000 )
            Vec_IntAddToEntry( vMffcs, 40 + nMffcs/10000, 1 );
        else if ( nMffcs < 1000000 )
            Vec_IntAddToEntry( vMffcs, 50 + nMffcs/100000, 1 );
        else if ( nMffcs < 10000000 )
            Vec_IntAddToEntry( vMffcs, 60 + nMffcs/1000000, 1 );
    }

    printf( "The distribution of fanins, fanouts. and MFFCs in the network:\n" );
    printf( "         Number    Nodes with fanin   Nodes with fanout   Nodes with MFFC\n" );

    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 && vMffcs->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%11d   ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "    " );
        if ( vMffcs->pArray[k] == 0 )
            printf( "               " );
        else
            printf( "  %12d  ", vMffcs->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );
    Vec_IntFree( vMffcs );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.  MFFCs: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll /Cof_ManNodeNum(p), 
        nFanoutsMax, 1.0*nFanoutsAll/Cof_ManNodeNum(p), 
        nMffcsMax,   1.0*nMffcsAll  /nMffcNodes  );
}